

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

void tt_interpolate_deltas
               (FT_Outline *outline,FT_Vector *out_points,FT_Vector *in_points,FT_Bool *has_delta)

{
  int p2;
  int p1;
  int ref2;
  int p2_00;
  bool bVar1;
  short local_3e;
  int local_3c;
  int iStack_38;
  FT_Short contour;
  FT_Int point;
  FT_Int cur_delta;
  FT_Int first_delta;
  FT_Int end_point;
  FT_Int first_point;
  FT_Bool *has_delta_local;
  FT_Vector *in_points_local;
  FT_Vector *out_points_local;
  FT_Outline *outline_local;
  
  if (outline->n_contours != 0) {
    local_3e = 0;
    local_3c = 0;
    do {
      p1 = local_3c;
      p2_00 = (int)outline->contours[local_3e];
      while( true ) {
        ref2 = local_3c;
        bVar1 = false;
        if (local_3c <= p2_00) {
          bVar1 = has_delta[local_3c] == '\0';
        }
        if (!bVar1) break;
        local_3c = local_3c + 1;
      }
      if (local_3c <= p2_00) {
        iStack_38 = local_3c;
        while (p2 = local_3c, local_3c = p2 + 1, local_3c <= p2_00) {
          if (has_delta[local_3c] != '\0') {
            tt_delta_interpolate(iStack_38 + 1,p2,iStack_38,local_3c,in_points,out_points);
            iStack_38 = local_3c;
          }
        }
        if (iStack_38 == ref2) {
          tt_delta_shift(p1,p2_00,iStack_38,in_points,out_points);
        }
        else {
          tt_delta_interpolate(iStack_38 + 1,p2_00,iStack_38,ref2,in_points,out_points);
          if (0 < ref2) {
            tt_delta_interpolate(p1,ref2 + -1,iStack_38,ref2,in_points,out_points);
          }
        }
      }
      local_3e = local_3e + 1;
    } while (local_3e < outline->n_contours);
  }
  return;
}

Assistant:

static void
  tt_interpolate_deltas( FT_Outline*  outline,
                         FT_Vector*   out_points,
                         FT_Vector*   in_points,
                         FT_Bool*     has_delta )
  {
    FT_Int  first_point;
    FT_Int  end_point;

    FT_Int  first_delta;
    FT_Int  cur_delta;

    FT_Int    point;
    FT_Short  contour;


    /* ignore empty outlines */
    if ( !outline->n_contours )
      return;

    contour = 0;
    point   = 0;

    do
    {
      end_point   = outline->contours[contour];
      first_point = point;

      /* search first point that has a delta */
      while ( point <= end_point && !has_delta[point] )
        point++;

      if ( point <= end_point )
      {
        first_delta = point;
        cur_delta   = point;

        point++;

        while ( point <= end_point )
        {
          /* search next point that has a delta  */
          /* and interpolate intermediate points */
          if ( has_delta[point] )
          {
            tt_delta_interpolate( cur_delta + 1,
                                  point - 1,
                                  cur_delta,
                                  point,
                                  in_points,
                                  out_points );
            cur_delta = point;
          }

          point++;
        }

        /* shift contour if we only have a single delta */
        if ( cur_delta == first_delta )
          tt_delta_shift( first_point,
                          end_point,
                          cur_delta,
                          in_points,
                          out_points );
        else
        {
          /* otherwise handle remaining points       */
          /* at the end and beginning of the contour */
          tt_delta_interpolate( cur_delta + 1,
                                end_point,
                                cur_delta,
                                first_delta,
                                in_points,
                                out_points );

          if ( first_delta > 0 )
            tt_delta_interpolate( first_point,
                                  first_delta - 1,
                                  cur_delta,
                                  first_delta,
                                  in_points,
                                  out_points );
        }
      }
      contour++;

    } while ( contour < outline->n_contours );
  }